

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

Emb_Obj_t * Emb_ManRandomVertex(Emb_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  Emb_Obj_t *pEVar3;
  Gia_Man_t *pGVar4;
  
  uVar1 = Gia_ManRandom(0);
  pGVar4 = p->pGia;
  uVar2 = (ulong)(uVar1 * 0x38f) % (ulong)(uint)pGVar4->nObjs;
  if ((-1 < (int)uVar2) && ((int)uVar2 < pGVar4->nObjs)) {
    do {
      uVar2 = (ulong)pGVar4->pObjs[uVar2].Value;
      if (uVar2 == 0xffffffff) {
        pEVar3 = (Emb_Obj_t *)0x0;
      }
      else {
        pEVar3 = (Emb_Obj_t *)(p->pObjData + uVar2);
      }
      if ((pEVar3 != (Emb_Obj_t *)0x0) && (0xf < *(uint *)pEVar3 && (*(uint *)pEVar3 & 3) == 0)) {
        return pEVar3;
      }
      uVar1 = Gia_ManRandom(0);
      pGVar4 = p->pGia;
      uVar2 = (ulong)(uVar1 * 0x38f) % (ulong)(uint)pGVar4->nObjs;
    } while ((-1 < (int)uVar2) && ((int)uVar2 < pGVar4->nObjs));
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Emb_Obj_t * Emb_ManRandomVertex( Emb_Man_t * p )
{
    Emb_Obj_t * pPivot;
    do {
        int iNode = (911 * Gia_ManRandom(0)) % Gia_ManObjNum(p->pGia);
        if ( ~Gia_ManObj(p->pGia, iNode)->Value )
            pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        else
            pPivot = NULL;
    }
    while ( pPivot == NULL || !Emb_ObjIsNode(pPivot) );
    return pPivot;
}